

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * tinyfd_saveFileDialog
                 (char *aTitle,char *aDefaultPathAndFile,int aNumOfFilterPatterns,
                 char **aFilterPatterns,char *aSingleFilterDescription)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  FILE *__stream;
  char *pcVar5;
  FILE *lIn;
  char *p;
  int lWasXterm;
  int lWasGraphicDialog;
  int i;
  char lString [1024];
  char lDialogString [1024];
  char *aSingleFilterDescription_local;
  char **aFilterPatterns_local;
  int aNumOfFilterPatterns_local;
  char *aDefaultPathAndFile_local;
  char *aTitle_local;
  
  bVar1 = false;
  bVar2 = false;
  tinyfd_saveFileDialog::lBuff[0] = '\0';
  iVar3 = osascriptPresent();
  if (iVar3 == 0) {
    iVar3 = kdialogPresent();
    if (iVar3 == 0) {
      iVar3 = zenityPresent();
      if ((((iVar3 == 0) && (iVar3 = matedialogPresent(), iVar3 == 0)) &&
          (iVar3 = shellementaryPresent(), iVar3 == 0)) && (iVar3 = qarmaPresent(), iVar3 == 0)) {
        iVar3 = xdialogPresent();
        if ((iVar3 == 0) && (iVar3 = tkinter2Present(), iVar3 != 0)) {
          if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
            strcpy(tinyfd_response,"python2-tkinter");
            return (char *)0x1;
          }
          strcpy(lString + 0x3f8,gPython2Name);
          iVar3 = isTerminalRunning();
          if ((iVar3 == 0) && (iVar3 = isDarwin(), iVar3 != 0)) {
            strcat(lString + 0x3f8," -i");
          }
          strcat(lString + 0x3f8,
                 " -S -c \"import Tkinter,tkFileDialog;root=Tkinter.Tk();root.withdraw();");
          iVar3 = isDarwin();
          if (iVar3 != 0) {
            strcat(lString + 0x3f8,
                   "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                  );
          }
          strcat(lString + 0x3f8,"print tkFileDialog.asksaveasfilename(");
          if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
            strcat(lString + 0x3f8,"title=\'");
            strcat(lString + 0x3f8,aTitle);
            strcat(lString + 0x3f8,"\',");
          }
          if ((aDefaultPathAndFile != (char *)0x0) &&
             (sVar4 = strlen(aDefaultPathAndFile), sVar4 != 0)) {
            getPathWithoutFinalSlash((char *)&lWasGraphicDialog,aDefaultPathAndFile);
            sVar4 = strlen((char *)&lWasGraphicDialog);
            if (sVar4 != 0) {
              strcat(lString + 0x3f8,"initialdir=\'");
              strcat(lString + 0x3f8,(char *)&lWasGraphicDialog);
              strcat(lString + 0x3f8,"\',");
            }
            getLastName((char *)&lWasGraphicDialog,aDefaultPathAndFile);
            sVar4 = strlen((char *)&lWasGraphicDialog);
            if (sVar4 != 0) {
              strcat(lString + 0x3f8,"initialfile=\'");
              strcat(lString + 0x3f8,(char *)&lWasGraphicDialog);
              strcat(lString + 0x3f8,"\',");
            }
          }
          if ((1 < aNumOfFilterPatterns) ||
             ((aNumOfFilterPatterns == 1 &&
              (pcVar5 = *aFilterPatterns, sVar4 = strlen(*aFilterPatterns), pcVar5[sVar4 - 1] != '*'
              )))) {
            strcat(lString + 0x3f8,"filetypes=(");
            strcat(lString + 0x3f8,"(\'");
            if ((aSingleFilterDescription != (char *)0x0) &&
               (sVar4 = strlen(aSingleFilterDescription), sVar4 != 0)) {
              strcat(lString + 0x3f8,aSingleFilterDescription);
            }
            strcat(lString + 0x3f8,"\',(");
            for (lWasXterm = 0; lWasXterm < aNumOfFilterPatterns; lWasXterm = lWasXterm + 1) {
              strcat(lString + 0x3f8,"\'");
              strcat(lString + 0x3f8,aFilterPatterns[lWasXterm]);
              strcat(lString + 0x3f8,"\',");
            }
            strcat(lString + 0x3f8,")),");
            strcat(lString + 0x3f8,"(\'All files\',\'*\'))");
          }
          strcat(lString + 0x3f8,")\"");
        }
        else {
          iVar3 = xdialogPresent();
          if ((iVar3 == 0) && (iVar3 = tkinter3Present(), iVar3 != 0)) {
            if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
              strcpy(tinyfd_response,"python3-tkinter");
              return (char *)0x1;
            }
            strcpy(lString + 0x3f8,gPython3Name);
            strcat(lString + 0x3f8,
                   " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                  );
            strcat(lString + 0x3f8,"print( filedialog.asksaveasfilename(");
            if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
              strcat(lString + 0x3f8,"title=\'");
              strcat(lString + 0x3f8,aTitle);
              strcat(lString + 0x3f8,"\',");
            }
            if ((aDefaultPathAndFile != (char *)0x0) &&
               (sVar4 = strlen(aDefaultPathAndFile), sVar4 != 0)) {
              getPathWithoutFinalSlash((char *)&lWasGraphicDialog,aDefaultPathAndFile);
              sVar4 = strlen((char *)&lWasGraphicDialog);
              if (sVar4 != 0) {
                strcat(lString + 0x3f8,"initialdir=\'");
                strcat(lString + 0x3f8,(char *)&lWasGraphicDialog);
                strcat(lString + 0x3f8,"\',");
              }
              getLastName((char *)&lWasGraphicDialog,aDefaultPathAndFile);
              sVar4 = strlen((char *)&lWasGraphicDialog);
              if (sVar4 != 0) {
                strcat(lString + 0x3f8,"initialfile=\'");
                strcat(lString + 0x3f8,(char *)&lWasGraphicDialog);
                strcat(lString + 0x3f8,"\',");
              }
            }
            if ((1 < aNumOfFilterPatterns) ||
               ((aNumOfFilterPatterns == 1 &&
                (pcVar5 = *aFilterPatterns, sVar4 = strlen(*aFilterPatterns),
                pcVar5[sVar4 - 1] != '*')))) {
              strcat(lString + 0x3f8,"filetypes=(");
              strcat(lString + 0x3f8,"(\'");
              if ((aSingleFilterDescription != (char *)0x0) &&
                 (sVar4 = strlen(aSingleFilterDescription), sVar4 != 0)) {
                strcat(lString + 0x3f8,aSingleFilterDescription);
              }
              strcat(lString + 0x3f8,"\',(");
              for (lWasXterm = 0; lWasXterm < aNumOfFilterPatterns; lWasXterm = lWasXterm + 1) {
                strcat(lString + 0x3f8,"\'");
                strcat(lString + 0x3f8,aFilterPatterns[lWasXterm]);
                strcat(lString + 0x3f8,"\',");
              }
              strcat(lString + 0x3f8,")),");
              strcat(lString + 0x3f8,"(\'All files\',\'*\'))");
            }
            strcat(lString + 0x3f8,"))\"");
          }
          else {
            iVar3 = xdialogPresent();
            if ((iVar3 == 0) && (pcVar5 = dialogName(), pcVar5 == (char *)0x0)) {
              if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
                pcVar5 = tinyfd_inputBox(aTitle,(char *)0x0,(char *)0x0);
                return pcVar5;
              }
              pcVar5 = tinyfd_inputBox(aTitle,"Save file","");
              getPathWithoutFinalSlash((char *)&lWasGraphicDialog,pcVar5);
              sVar4 = strlen((char *)&lWasGraphicDialog);
              if ((sVar4 != 0) && (iVar3 = dirExists((char *)&lWasGraphicDialog), iVar3 == 0)) {
                return (char *)0x0;
              }
              getLastName((char *)&lWasGraphicDialog,pcVar5);
              sVar4 = strlen((char *)&lWasGraphicDialog);
              if (sVar4 != 0) {
                return pcVar5;
              }
              return (char *)0x0;
            }
            iVar3 = xdialogPresent();
            if (iVar3 == 0) {
              iVar3 = isTerminalRunning();
              if (iVar3 == 0) {
                if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0))
                {
                  strcpy(tinyfd_response,"dialog");
                  return (char *)0x0;
                }
                bVar2 = true;
                pcVar5 = terminalName();
                strcpy(lString + 0x3f8,pcVar5);
                strcat(lString + 0x3f8,"\'(");
                pcVar5 = dialogName();
                strcat(lString + 0x3f8,pcVar5);
                strcat(lString + 0x3f8," ");
              }
              else {
                if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0))
                {
                  strcpy(tinyfd_response,"dialog");
                  return (char *)0x0;
                }
                strcpy(lString + 0x3f8,"(dialog ");
              }
            }
            else {
              if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
                strcpy(tinyfd_response,"xdialog");
                return (char *)0x1;
              }
              bVar1 = true;
              strcpy(lString + 0x3f8,"(Xdialog ");
            }
            if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
              strcat(lString + 0x3f8,"--title \"");
              strcat(lString + 0x3f8,aTitle);
              strcat(lString + 0x3f8,"\" ");
            }
            iVar3 = xdialogPresent();
            if ((iVar3 == 0) && (iVar3 = gdialogPresent(), iVar3 == 0)) {
              strcat(lString + 0x3f8,"--backtitle \"");
              strcat(lString + 0x3f8,
                     "tab: focus | /: populate | spacebar: fill text field | ok: TEXT FIELD ONLY");
              strcat(lString + 0x3f8,"\" ");
            }
            strcat(lString + 0x3f8,"--fselect \"");
            if ((aDefaultPathAndFile == (char *)0x0) ||
               (sVar4 = strlen(aDefaultPathAndFile), sVar4 == 0)) {
              iVar3 = isTerminalRunning();
              if ((iVar3 != 0) || (bVar1)) {
                strcat(lString + 0x3f8,"./");
              }
              else {
                pcVar5 = getenv("HOME");
                strcat(lString + 0x3f8,pcVar5);
                strcat(lString + 0x3f8,"/");
              }
            }
            else {
              pcVar5 = strchr(aDefaultPathAndFile,0x2f);
              if (pcVar5 == (char *)0x0) {
                strcat(lString + 0x3f8,"./");
              }
              strcat(lString + 0x3f8,aDefaultPathAndFile);
            }
            if (bVar1) {
              strcat(lString + 0x3f8,"\" 0 60 ) 2>&1 ");
            }
            else {
              strcat(lString + 0x3f8,"\" 0 60  >/dev/tty) ");
              if (bVar2) {
                strcat(lString + 0x3f8,"2>/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt")
                ;
              }
              else {
                strcat(lString + 0x3f8,"2>&1 ; clear >/dev/tty");
              }
            }
          }
        }
      }
      else {
        iVar3 = zenityPresent();
        if (iVar3 == 0) {
          iVar3 = matedialogPresent();
          if (iVar3 == 0) {
            iVar3 = shellementaryPresent();
            if (iVar3 == 0) {
              if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
                strcpy(tinyfd_response,"qarma");
                return (char *)0x1;
              }
              strcpy(lString + 0x3f8,"qarma");
              pcVar5 = getenv("SSH_TTY");
              if (pcVar5 == (char *)0x0) {
                strcat(lString + 0x3f8,
                       " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
              }
            }
            else {
              if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
                strcpy(tinyfd_response,"shellementary");
                return (char *)0x1;
              }
              strcpy(lString + 0x3f8,"shellementary");
            }
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
              strcpy(tinyfd_response,"matedialog");
              return (char *)0x1;
            }
            strcpy(lString + 0x3f8,"matedialog");
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
            strcpy(tinyfd_response,"zenity");
            return (char *)0x1;
          }
          strcpy(lString + 0x3f8,"zenity");
          iVar3 = zenity3Present();
          if ((3 < iVar3) && (pcVar5 = getenv("SSH_TTY"), pcVar5 == (char *)0x0)) {
            strcat(lString + 0x3f8,
                   " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
          }
        }
        strcat(lString + 0x3f8," --file-selection --save --confirm-overwrite");
        if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
          strcat(lString + 0x3f8," --title=\"");
          strcat(lString + 0x3f8,aTitle);
          strcat(lString + 0x3f8,"\"");
        }
        if ((aDefaultPathAndFile != (char *)0x0) &&
           (sVar4 = strlen(aDefaultPathAndFile), sVar4 != 0)) {
          strcat(lString + 0x3f8," --filename=\"");
          strcat(lString + 0x3f8,aDefaultPathAndFile);
          strcat(lString + 0x3f8,"\"");
        }
        if (0 < aNumOfFilterPatterns) {
          strcat(lString + 0x3f8," --file-filter=\'");
          if ((aSingleFilterDescription != (char *)0x0) &&
             (sVar4 = strlen(aSingleFilterDescription), sVar4 != 0)) {
            strcat(lString + 0x3f8,aSingleFilterDescription);
            strcat(lString + 0x3f8," | ");
          }
          for (lWasXterm = 0; lWasXterm < aNumOfFilterPatterns; lWasXterm = lWasXterm + 1) {
            strcat(lString + 0x3f8,aFilterPatterns[lWasXterm]);
            strcat(lString + 0x3f8," ");
          }
          strcat(lString + 0x3f8,"\' --file-filter=\'All files | *\'");
        }
        if (tinyfd_silent != 0) {
          strcat(lString + 0x3f8," 2>/dev/null ");
        }
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
        strcpy(tinyfd_response,"kdialog");
        return (char *)0x1;
      }
      strcpy(lString + 0x3f8,"kdialog");
      iVar3 = kdialogPresent();
      if (iVar3 == 2) {
        strcat(lString + 0x3f8," --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)"
              );
      }
      strcat(lString + 0x3f8," --getsavefilename ");
      if ((aDefaultPathAndFile == (char *)0x0) || (sVar4 = strlen(aDefaultPathAndFile), sVar4 == 0))
      {
        strcat(lString + 0x3f8,"$PWD/");
      }
      else {
        if (*aDefaultPathAndFile != '/') {
          strcat(lString + 0x3f8,"$PWD/");
        }
        strcat(lString + 0x3f8,"\"");
        strcat(lString + 0x3f8,aDefaultPathAndFile);
        strcat(lString + 0x3f8,"\"");
      }
      if (0 < aNumOfFilterPatterns) {
        strcat(lString + 0x3f8," \"");
        for (lWasXterm = 0; lWasXterm < aNumOfFilterPatterns; lWasXterm = lWasXterm + 1) {
          strcat(lString + 0x3f8,aFilterPatterns[lWasXterm]);
          strcat(lString + 0x3f8," ");
        }
        if ((aSingleFilterDescription != (char *)0x0) &&
           (sVar4 = strlen(aSingleFilterDescription), sVar4 != 0)) {
          strcat(lString + 0x3f8," | ");
          strcat(lString + 0x3f8,aSingleFilterDescription);
        }
        strcat(lString + 0x3f8,"\"");
      }
      if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
        strcat(lString + 0x3f8," --title \"");
        strcat(lString + 0x3f8,aTitle);
        strcat(lString + 0x3f8,"\"");
      }
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
      strcpy(tinyfd_response,"applescript");
      return (char *)0x1;
    }
    strcpy(lString + 0x3f8,"osascript ");
    iVar3 = osx9orBetter();
    if (iVar3 == 0) {
      strcat(lString + 0x3f8," -e \'tell application \"Finder\"\' -e \'Activate\'");
    }
    strcat(lString + 0x3f8," -e \'try\' -e \'POSIX path of ( choose file name ");
    if ((aTitle != (char *)0x0) && (sVar4 = strlen(aTitle), sVar4 != 0)) {
      strcat(lString + 0x3f8,"with prompt \"");
      strcat(lString + 0x3f8,aTitle);
      strcat(lString + 0x3f8,"\" ");
    }
    getPathWithoutFinalSlash((char *)&lWasGraphicDialog,aDefaultPathAndFile);
    sVar4 = strlen((char *)&lWasGraphicDialog);
    if (sVar4 != 0) {
      strcat(lString + 0x3f8,"default location \"");
      strcat(lString + 0x3f8,(char *)&lWasGraphicDialog);
      strcat(lString + 0x3f8,"\" ");
    }
    getLastName((char *)&lWasGraphicDialog,aDefaultPathAndFile);
    sVar4 = strlen((char *)&lWasGraphicDialog);
    if (sVar4 != 0) {
      strcat(lString + 0x3f8,"default name \"");
      strcat(lString + 0x3f8,(char *)&lWasGraphicDialog);
      strcat(lString + 0x3f8,"\" ");
    }
    strcat(lString + 0x3f8,")\' ");
    strcat(lString + 0x3f8,"-e \'on error number -128\' ");
    strcat(lString + 0x3f8,"-e \'end try\'");
    iVar3 = osx9orBetter();
    if (iVar3 == 0) {
      strcat(lString + 0x3f8," -e \'end tell\'");
    }
  }
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",lString + 0x3f8);
  }
  __stream = popen(lString + 0x3f8,"r");
  if (__stream == (FILE *)0x0) {
    aTitle_local = (char *)0x0;
  }
  else {
    do {
      pcVar5 = fgets(tinyfd_saveFileDialog::lBuff,0x400,__stream);
    } while (pcVar5 != (char *)0x0);
    pclose(__stream);
    sVar4 = strlen(tinyfd_saveFileDialog::lBuff);
    if (tinyfd_inputBox::lBuff[sVar4 + 0x3ff] == '\n') {
      sVar4 = strlen(tinyfd_saveFileDialog::lBuff);
      tinyfd_inputBox::lBuff[sVar4 + 0x3ff] = '\0';
    }
    sVar4 = strlen(tinyfd_saveFileDialog::lBuff);
    if (sVar4 == 0) {
      aTitle_local = (char *)0x0;
    }
    else {
      getPathWithoutFinalSlash((char *)&lWasGraphicDialog,tinyfd_saveFileDialog::lBuff);
      sVar4 = strlen((char *)&lWasGraphicDialog);
      if ((sVar4 == 0) || (iVar3 = dirExists((char *)&lWasGraphicDialog), iVar3 != 0)) {
        getLastName((char *)&lWasGraphicDialog,tinyfd_saveFileDialog::lBuff);
        iVar3 = filenameValid((char *)&lWasGraphicDialog);
        if (iVar3 == 0) {
          aTitle_local = (char *)0x0;
        }
        else {
          aTitle_local = tinyfd_saveFileDialog::lBuff;
        }
      }
      else {
        aTitle_local = (char *)0x0;
      }
    }
  }
  return aTitle_local;
}

Assistant:

char const * tinyfd_saveFileDialog(
        char const * const aTitle , /* NULL or "" */
        char const * const aDefaultPathAndFile , /* NULL or "" */
        int const aNumOfFilterPatterns , /* 0 */
        char const * const * const aFilterPatterns , /* NULL or {"*.jpg","*.png"} */
        char const * const aSingleFilterDescription ) /* NULL or "image files" */
{
        static char lBuff [MAX_PATH_OR_CMD] ;
        char lString[MAX_PATH_OR_CMD] ;
        char const * p ;
        lBuff[0]='\0';
#ifndef TINYFD_NOLIB
        if ( ( !tinyfd_forceConsole || !( GetConsoleWindow() || dialogPresent() ) )
          && ( !getenv("SSH_CLIENT") || getenv("DISPLAY") ) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                if (tinyfd_winUtf8)
                {
                        p = saveFileDialogWinGui8(lBuff,
                                aTitle, aDefaultPathAndFile, aNumOfFilterPatterns, aFilterPatterns, aSingleFilterDescription);
                }
                else
                {
                        p = saveFileDialogWinGuiA(lBuff,
                                aTitle, aDefaultPathAndFile, aNumOfFilterPatterns, aFilterPatterns, aSingleFilterDescription);
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return (char const *)0;}
                p = saveFileDialogWinConsole(lBuff,aTitle,aDefaultPathAndFile);
        }
        else
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return (char const *)0;}
                p = tinyfd_inputBox(aTitle, "Save file","");
        }

        if ( ! p || ! strlen( p )  )
        {
                return NULL;
        }
        getPathWithoutFinalSlash( lString , p ) ;
        if ( strlen( lString ) && ! dirExists( lString ) )
        {
                return NULL ;
        }
        getLastName(lString,p);
        if ( ! filenameValid(lString) )
        {
                return NULL;
        }
        return p ;
}